

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O3

Ptr __thiscall
core::image::double_to_byte_image(image *this,ConstPtr *image,double vmin,double vmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  element_type *peVar5;
  Image<unsigned_char> *__p;
  long lVar6;
  invalid_argument *this_00;
  pointer pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  double dVar9;
  Ptr PVar10;
  
  if ((image->super___shared_ptr<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    __p = (Image<unsigned_char> *)operator_new(0x30);
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.w = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.h = 0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase.c = 0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).data.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_char>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_00127d08;
    *(Image<unsigned_char> **)this = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_char>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
    plVar4 = *(long **)this;
    peVar5 = (image->super___shared_ptr<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar1 = (peVar5->super_TypedImageBase<double>).super_ImageBase.w;
    iVar2 = (peVar5->super_TypedImageBase<double>).super_ImageBase.h;
    iVar3 = (peVar5->super_TypedImageBase<double>).super_ImageBase.c;
    (**(code **)(*plVar4 + 0x40))(plVar4);
    *(int *)(plVar4 + 1) = iVar1;
    *(int *)((long)plVar4 + 0xc) = iVar2;
    *(int *)(plVar4 + 2) = iVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(plVar4 + 3),
               (long)(iVar2 * iVar1 * iVar3));
    peVar5 = (image->super___shared_ptr<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pdVar7 = (peVar5->super_TypedImageBase<double>).data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    _Var8._M_pi = extraout_RDX;
    if (0 < (int)((ulong)((long)*(pointer *)
                                 ((long)&(peVar5->super_TypedImageBase<double>).data.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + 8) - (long)pdVar7) >> 3)) {
      lVar6 = 0;
      do {
        dVar9 = pdVar7[lVar6];
        if (pdVar7[lVar6] <= vmin) {
          dVar9 = vmin;
        }
        if (vmax <= dVar9) {
          dVar9 = vmax;
        }
        *(char *)(*(long *)(*(long *)this + 0x18) + lVar6) =
             (char)(int)(((dVar9 - vmin) * 255.0) / (vmax - vmin) + 0.5);
        lVar6 = lVar6 + 1;
        peVar5 = (image->super___shared_ptr<const_core::Image<double>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        pdVar7 = (peVar5->super_TypedImageBase<double>).data.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (long)(int)((ulong)((long)*(pointer *)
                                                 ((long)&(peVar5->super_TypedImageBase<double>).data
                                                         .
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                         (long)pdVar7) >> 3);
      } while (lVar6 < (long)_Var8._M_pi);
    }
    PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var8._M_pi;
    PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar10.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ByteImage::Ptr
double_to_byte_image (DoubleImage::ConstPtr image, double vmin, double vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        double value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0 * (value - vmin) / (vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5);
    }
    return img;
}